

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

void Ssc_GiaSimClassCreate(Gia_Man_t *p,Vec_Int_t *vClass)

{
  int iVar1;
  int Id;
  int i;
  int iVar2;
  int Num;
  
  iVar1 = vClass->nSize;
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vClass) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscClass.c"
                  ,0x83,"void Ssc_GiaSimClassCreate(Gia_Man_t *, Vec_Int_t *)");
  }
  i = 0;
  Num = 0xfffffff;
  iVar2 = -1;
  do {
    if (iVar1 <= i) {
      p->pNexts[iVar2] = 0;
      return;
    }
    Id = Vec_IntEntry(vClass,i);
    if (i == 0) {
      p->pReprs[Id] = (Gia_Rpr_t)((uint)p->pReprs[Id] | 0xfffffff);
      Num = Id;
    }
    else {
      if (Id <= Num) {
        __assert_fail("Repr < Ent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscClass.c"
                      ,0x8e,"void Ssc_GiaSimClassCreate(Gia_Man_t *, Vec_Int_t *)");
      }
      Gia_ObjSetRepr(p,Id,Num);
      p->pNexts[iVar2] = Id;
    }
    i = i + 1;
    iVar1 = vClass->nSize;
    iVar2 = Id;
  } while( true );
}

Assistant:

void Ssc_GiaSimClassCreate( Gia_Man_t * p, Vec_Int_t * vClass )
{
    int Repr = GIA_VOID, EntPrev = -1, Ent, i;
    assert( Vec_IntSize(vClass) > 0 );
    Vec_IntForEachEntry( vClass, Ent, i )
    {
        if ( i == 0 )
        {
            Repr = Ent;
            Gia_ObjSetRepr( p, Ent, GIA_VOID );
            EntPrev = Ent;
        }
        else
        {
            assert( Repr < Ent );
            Gia_ObjSetRepr( p, Ent, Repr );
            Gia_ObjSetNext( p, EntPrev, Ent );
            EntPrev = Ent;
        }
    }
    Gia_ObjSetNext( p, EntPrev, 0 );
}